

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O0

void amrex::EB2::Build(Geometry *geom,int required_coarsening_level,int max_coarsening_level,
                      int ngrow,bool build_coarse_level_by_coarsening,bool a_extend_domain_face,
                      int a_num_coarsen_opt)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  iVar1;
  initializer_list<double> __l;
  bool bVar2;
  undefined1 uVar3;
  reference pvVar4;
  literals *this;
  byte in_R8B;
  byte in_R9B;
  uint uVar5;
  int stl_reverse_normal;
  vector<double,_std::allocator<double>_> stl_center;
  Real stl_scale;
  string stl_file;
  GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> gshop_6;
  ParserIF pif;
  Parser parser;
  string fn_string;
  GeometryShop<amrex::EB2::TorusIF,_int> gshop_5;
  TorusIF sf_1;
  bool has_fluid_inside_3;
  Real large_radius;
  Real small_radius;
  RealArray center_2;
  GeometryShop<amrex::EB2::SphereIF,_int> gshop_4;
  SphereIF sf;
  bool has_fluid_inside_2;
  Real radius_1;
  RealArray center_1;
  GeometryShop<amrex::EB2::PlaneIF,_int> gshop_3;
  PlaneIF pf;
  RealArray normal;
  RealArray point;
  GeometryShop<amrex::EB2::CylinderIF,_int> gshop_2;
  CylinderIF cf;
  bool has_fluid_inside_1;
  int direction;
  Real height;
  Real radius;
  RealArray center;
  GeometryShop<amrex::EB2::BoxIF,_int> gshop_1;
  BoxIF bf;
  bool has_fluid_inside;
  RealArray hi;
  RealArray lo;
  GeometryShop<amrex::EB2::AllRegularIF,_int> gshop;
  AllRegularIF rif;
  string geom_type;
  ParmParse pp;
  undefined4 in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff90c;
  undefined2 in_stack_fffffffffffff910;
  undefined2 uVar6;
  undefined2 in_stack_fffffffffffff912;
  undefined4 in_stack_fffffffffffff914;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  undefined4 in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  BoxIF *in_stack_fffffffffffff930;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type *in_stack_fffffffffffff938;
  TorusIF *in_stack_fffffffffffff940;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  iterator pdVar7;
  Geometry *in_stack_fffffffffffff950;
  Real RVar8;
  GeometryShop<amrex::EB2::TorusIF,_int> *in_stack_fffffffffffff958;
  undefined7 in_stack_fffffffffffff960;
  undefined1 in_stack_fffffffffffff967;
  int in_stack_fffffffffffff978;
  int in_stack_fffffffffffff97c;
  string *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff988;
  ParmParse *in_stack_fffffffffffff990;
  string *local_658;
  string local_5e8 [32];
  string local_5c8 [32];
  value_type local_5a8;
  value_type local_5a0;
  value_type local_598;
  undefined4 local_590;
  undefined1 local_589;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 *local_568;
  undefined8 local_560;
  vector<double,_std::allocator<double>_> local_558;
  Real local_540;
  string local_538 [56];
  ParserExecutor<3> local_500;
  ParserIF local_4f8;
  undefined1 local_4ec;
  allocator local_4eb;
  allocator local_4ea;
  allocator local_4e9;
  string *local_4e8;
  string local_4e0 [8];
  char *in_stack_fffffffffffffb28;
  int in_stack_fffffffffffffb34;
  char *in_stack_fffffffffffffb38;
  char *in_stack_fffffffffffffb40;
  string local_4a0 [32];
  string *local_480;
  undefined8 local_478;
  string local_448 [32];
  GeometryShop<amrex::EB2::TorusIF,_int> local_428;
  undefined1 local_3a9;
  undefined1 in_stack_fffffffffffffca2;
  undefined1 in_stack_fffffffffffffca3;
  int in_stack_fffffffffffffca4;
  Geometry *in_stack_fffffffffffffca8;
  int in_stack_fffffffffffffcb4;
  Array<Real,_3> *in_stack_fffffffffffffcb8;
  Real in_stack_fffffffffffffcc0;
  string *in_stack_fffffffffffffcc8;
  IndexSpaceSTL *in_stack_fffffffffffffcd0;
  GeometryShop<amrex::EB2::PlaneIF,_int> local_300 [2];
  GeometryShop<amrex::EB2::CylinderIF,_int> local_258;
  int local_1dc;
  undefined8 local_1d8;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffea0;
  GeometryShop<amrex::EB2::AllRegularIF,_int> local_fc;
  AllRegularIF local_f1;
  string local_f0 [55];
  allocator local_b9;
  string local_b8 [32];
  literals local_98 [90];
  byte local_3e;
  byte local_3d;
  char *local_28;
  undefined4 local_1c;
  char *local_18;
  char *local_10;
  
  local_3d = in_R8B & 1;
  local_3e = in_R9B & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"eb2",&local_b9);
  ParmParse::ParmParse
            ((ParmParse *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
             (string *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::string(local_f0);
  ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                 in_stack_fffffffffffff97c);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff914,
                                   CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                          (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
  if (bVar2) {
    GeometryShop<amrex::EB2::AllRegularIF,_int>::GeometryShop(&local_fc,&local_f1);
    Build<amrex::EB2::GeometryShop<amrex::EB2::AllRegularIF,int>>
              ((GeometryShop<amrex::EB2::AllRegularIF,_int> *)in_stack_fffffffffffff958,
               in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
               (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978);
    GeometryShop<amrex::EB2::AllRegularIF,_int>::~GeometryShop(&local_fc);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffff914,
                                     CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                            (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
    if (bVar2) {
      ParmParse::get<double,3ul>
                ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                 (char *)in_stack_fffffffffffff958,(array<double,_3UL> *)in_stack_fffffffffffff950);
      uVar3 = (undefined1)((uint)in_stack_fffffffffffff91c >> 0x18);
      ParmParse::get<double,3ul>
                ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                 (char *)in_stack_fffffffffffff958,(array<double,_3UL> *)in_stack_fffffffffffff950);
      ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                     (bool *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
      BoxIF::BoxIF(in_stack_fffffffffffff930,
                   (RealArray *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                   (RealArray *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   (bool)uVar3);
      GeometryShop<amrex::EB2::BoxIF,_int>::GeometryShop
                ((GeometryShop<amrex::EB2::BoxIF,_int> *)
                 CONCAT44(in_stack_fffffffffffff914,
                          CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                 (BoxIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
      Build<amrex::EB2::GeometryShop<amrex::EB2::BoxIF,int>>
                ((GeometryShop<amrex::EB2::BoxIF,_int> *)in_stack_fffffffffffff958,
                 in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                 (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                 SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978);
      GeometryShop<amrex::EB2::BoxIF,_int>::~GeometryShop
                ((GeometryShop<amrex::EB2::BoxIF,_int> *)&stack0xfffffffffffffe50);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff914,
                                       CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)
                                      ),
                              (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908))
      ;
      if (bVar2) {
        ParmParse::get<double,3ul>
                  ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (char *)in_stack_fffffffffffff958,(array<double,_3UL> *)in_stack_fffffffffffff950
                  );
        uVar3 = (undefined1)((ulong)in_stack_fffffffffffff938 >> 0x38);
        ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (double *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        local_1d8 = 0xbff0000000000000;
        ParmParse::queryAdd<double,_0>
                  ((ParmParse *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                   (double *)
                   CONCAT44(in_stack_fffffffffffff914,
                            CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)));
        ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (int *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        if ((local_1dc < 0) || (2 < local_1dc)) {
          local_10 = "direction >=0 && direction < 3";
          local_18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2.cpp"
          ;
          local_1c = 0x83;
          local_28 = "\"eb2.cylinder_direction is invalid\"";
          Assert_host(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb34,
                      in_stack_fffffffffffffb28);
        }
        ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                       (bool *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
        CylinderIF::CylinderIF
                  ((CylinderIF *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                   (Real)in_stack_fffffffffffff958,(Real)in_stack_fffffffffffff950,
                   in_stack_fffffffffffff94c,(RealArray *)in_stack_fffffffffffff940,(bool)uVar3);
        GeometryShop<amrex::EB2::CylinderIF,_int>::GeometryShop
                  ((GeometryShop<amrex::EB2::CylinderIF,_int> *)
                   CONCAT44(in_stack_fffffffffffff914,
                            CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                   (CylinderIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
        Build<amrex::EB2::GeometryShop<amrex::EB2::CylinderIF,int>>
                  ((GeometryShop<amrex::EB2::CylinderIF,_int> *)in_stack_fffffffffffff958,
                   in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                   (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978);
        GeometryShop<amrex::EB2::CylinderIF,_int>::~GeometryShop(&local_258);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff914,
                                          CONCAT22(in_stack_fffffffffffff912,
                                                   in_stack_fffffffffffff910)),
                                (char *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908
                                                ));
        if (bVar2) {
          ParmParse::get<double,3ul>
                    ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                     (char *)in_stack_fffffffffffff958,
                     (array<double,_3UL> *)in_stack_fffffffffffff950);
          uVar3 = (undefined1)((uint)in_stack_fffffffffffff91c >> 0x18);
          ParmParse::get<double,3ul>
                    ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                     (char *)in_stack_fffffffffffff958,
                     (array<double,_3UL> *)in_stack_fffffffffffff950);
          PlaneIF::PlaneIF((PlaneIF *)in_stack_fffffffffffff930,
                           (RealArray *)
                           CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                           (RealArray *)
                           CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),(bool)uVar3
                          );
          GeometryShop<amrex::EB2::PlaneIF,_int>::GeometryShop
                    ((GeometryShop<amrex::EB2::PlaneIF,_int> *)
                     CONCAT44(in_stack_fffffffffffff914,
                              CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                     (PlaneIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
          Build<amrex::EB2::GeometryShop<amrex::EB2::PlaneIF,int>>
                    ((GeometryShop<amrex::EB2::PlaneIF,_int> *)in_stack_fffffffffffff958,
                     in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                     (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978);
          GeometryShop<amrex::EB2::PlaneIF,_int>::~GeometryShop(local_300);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff914,
                                              CONCAT22(in_stack_fffffffffffff912,
                                                       in_stack_fffffffffffff910)),
                                  (char *)CONCAT44(in_stack_fffffffffffff90c,
                                                   in_stack_fffffffffffff908));
          if (bVar2) {
            ParmParse::get<double,3ul>
                      ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                       (char *)in_stack_fffffffffffff958,
                       (array<double,_3UL> *)in_stack_fffffffffffff950);
            uVar3 = (undefined1)((uint)in_stack_fffffffffffff91c >> 0x18);
            ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                           (double *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
            ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                           (bool *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
            SphereIF::SphereIF((SphereIF *)in_stack_fffffffffffff930,
                               (Real)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               (RealArray *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (bool)uVar3);
            GeometryShop<amrex::EB2::SphereIF,_int>::GeometryShop
                      ((GeometryShop<amrex::EB2::SphereIF,_int> *)
                       CONCAT44(in_stack_fffffffffffff914,
                                CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                       (SphereIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
            Build<amrex::EB2::GeometryShop<amrex::EB2::SphereIF,int>>
                      ((GeometryShop<amrex::EB2::SphereIF,_int> *)in_stack_fffffffffffff958,
                       in_stack_fffffffffffff950,in_stack_fffffffffffff94c,in_stack_fffffffffffff948
                       ,(int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                       SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                       SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978);
            GeometryShop<amrex::EB2::SphereIF,_int>::~GeometryShop
                      ((GeometryShop<amrex::EB2::SphereIF,_int> *)&stack0xfffffffffffffc80);
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff914,
                                                CONCAT22(in_stack_fffffffffffff912,
                                                         in_stack_fffffffffffff910)),
                                    (char *)CONCAT44(in_stack_fffffffffffff90c,
                                                     in_stack_fffffffffffff908));
            if (bVar2) {
              ParmParse::get<double,3ul>
                        ((ParmParse *)CONCAT17(in_stack_fffffffffffff967,in_stack_fffffffffffff960),
                         (char *)in_stack_fffffffffffff958,
                         (array<double,_3UL> *)in_stack_fffffffffffff950);
              uVar3 = (undefined1)((uint)in_stack_fffffffffffff924 >> 0x18);
              ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                             (double *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
              ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                             (double *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
              local_3a9 = 1;
              TorusIF::TorusIF(in_stack_fffffffffffff940,(Real)in_stack_fffffffffffff938,
                               (Real)in_stack_fffffffffffff930,
                               (RealArray *)
                               CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
                               (bool)uVar3);
              GeometryShop<amrex::EB2::TorusIF,_int>::GeometryShop
                        ((GeometryShop<amrex::EB2::TorusIF,_int> *)
                         CONCAT44(in_stack_fffffffffffff914,
                                  CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                         (TorusIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
              Build<amrex::EB2::GeometryShop<amrex::EB2::TorusIF,int>>
                        (in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                         in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                         (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                         SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),in_stack_fffffffffffff978
                        );
              GeometryShop<amrex::EB2::TorusIF,_int>::~GeometryShop(&local_428);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff914,
                                                  CONCAT22(in_stack_fffffffffffff912,
                                                           in_stack_fffffffffffff910)),
                                      (char *)CONCAT44(in_stack_fffffffffffff90c,
                                                       in_stack_fffffffffffff908));
              if (bVar2) {
                std::__cxx11::string::string(local_448);
                ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                               in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
                Parser::Parser((Parser *)
                               CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                               (string *)
                               CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918));
                local_4ec = 1;
                local_4e8 = local_4e0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4e0,"x",&local_4e9);
                local_4e8 = (string *)&stack0xfffffffffffffb40;
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&stack0xfffffffffffffb40,"y",&local_4ea);
                local_4e8 = local_4a0;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4a0,"z",&local_4eb);
                local_4ec = 0;
                local_480 = local_4e0;
                local_478 = 3;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x1197e01);
                iVar1._M_array._4_4_ = in_stack_fffffffffffff91c;
                iVar1._M_array._0_4_ = in_stack_fffffffffffff918;
                iVar1._M_len._0_4_ = in_stack_fffffffffffff920;
                iVar1._M_len._4_4_ = in_stack_fffffffffffff924;
                Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff914,
                                     CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                         iVar1,(allocator_type *)
                               CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
                Parser::registerVariables
                          ((Parser *)in_stack_fffffffffffff930,
                           (Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
                Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x1197e4c);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)0x1197e59);
                local_658 = (string *)&local_480;
                do {
                  local_658 = local_658 + -0x20;
                  std::__cxx11::string::~string(local_658);
                } while (local_658 != local_4e0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4eb);
                std::allocator<char>::~allocator((allocator<char> *)&local_4ea);
                std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
                local_500 = Parser::compile<3>((Parser *)
                                               CONCAT44(in_stack_fffffffffffff90c,
                                                        in_stack_fffffffffffff908));
                ParserIF::ParserIF(&local_4f8,&local_500);
                GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>::GeometryShop
                          ((GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)
                           CONCAT44(in_stack_fffffffffffff914,
                                    CONCAT22(in_stack_fffffffffffff912,in_stack_fffffffffffff910)),
                           (ParserIF *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908)
                           ,(Parser *)0x1197f2d);
                Build<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>
                          ((GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)
                           in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                           in_stack_fffffffffffff94c,in_stack_fffffffffffff948,
                           (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff940 >> 0x18,0),
                           SUB81((ulong)in_stack_fffffffffffff940 >> 0x10,0),
                           in_stack_fffffffffffff978);
                GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>::~GeometryShop
                          ((GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *)0x1197f92);
                Parser::~Parser((Parser *)0x1197f9f);
                std::__cxx11::string::~string(local_448);
              }
              else {
                uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff914,
                                                    CONCAT22(in_stack_fffffffffffff912,
                                                             in_stack_fffffffffffff910)),
                                        (char *)CONCAT44(in_stack_fffffffffffff90c,
                                                         in_stack_fffffffffffff908));
                if ((bool)uVar3) {
                  std::__cxx11::string::string(local_538);
                  this = local_98;
                  ParmParse::get(in_stack_fffffffffffff990,in_stack_fffffffffffff988,
                                 in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
                  uVar6 = (undefined2)((unkuint10)(longdouble)1 >> 0x40);
                  RVar8 = literals::operator____rt(this,(longdouble)1);
                  local_540 = RVar8;
                  ParmParse::queryAdd<double,_0>
                            ((ParmParse *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                             (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                             (double *)
                             CONCAT44(in_stack_fffffffffffff914,
                                      CONCAT22(in_stack_fffffffffffff912,uVar6)));
                  local_588 = 0;
                  uStack_580 = 0;
                  local_578 = 0;
                  local_568 = &local_588;
                  local_560 = 3;
                  pdVar7 = (iterator)&local_589;
                  std::allocator<double>::allocator((allocator<double> *)0x119824e);
                  __l._M_len = (size_type)RVar8;
                  __l._M_array = pdVar7;
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff940,
                             __l,in_stack_fffffffffffff938);
                  std::allocator<double>::~allocator((allocator<double> *)0x119827f);
                  ParmParse::queryAdd<double>
                            ((ParmParse *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                             (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                             (vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff914,
                                      CONCAT22(in_stack_fffffffffffff912,uVar6)));
                  local_590 = 0;
                  ParmParse::queryAdd<int,_0>
                            ((ParmParse *)
                             CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                             (char *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                             (int *)CONCAT44(in_stack_fffffffffffff914,
                                             CONCAT22(in_stack_fffffffffffff912,uVar6)));
                  operator_new(0x68);
                  this_00 = &local_558;
                  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
                  local_5a8 = *pvVar4;
                  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
                  local_5a0 = *pvVar4;
                  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
                  local_598 = *pvVar4;
                  uVar5 = local_3e & 1;
                  IndexSpaceSTL::IndexSpaceSTL
                            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                             in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
                             in_stack_fffffffffffffcb4,in_stack_fffffffffffffca8,
                             in_stack_fffffffffffffca4,in_stack_fffffffffffffe80,
                             in_stack_fffffffffffffe88,(bool)in_stack_fffffffffffffca3,
                             (bool)in_stack_fffffffffffffca2,in_stack_fffffffffffffea0);
                  IndexSpace::push((IndexSpace *)CONCAT17(uVar3,in_stack_fffffffffffff960));
                  std::vector<double,_std::allocator<double>_>::~vector
                            ((vector<double,_std::allocator<double>_> *)
                             CONCAT44(in_stack_fffffffffffff924,uVar5));
                  std::__cxx11::string::~string(local_538);
                }
                else {
                  std::operator+((char *)in_stack_fffffffffffff958,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff950);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT44(in_stack_fffffffffffff91c,in_stack_fffffffffffff918),
                                 (char *)CONCAT44(in_stack_fffffffffffff914,
                                                  CONCAT22(in_stack_fffffffffffff912,
                                                           in_stack_fffffffffffff910)));
                  Abort((string *)CONCAT44(in_stack_fffffffffffff90c,in_stack_fffffffffffff908));
                  std::__cxx11::string::~string(local_5c8);
                  std::__cxx11::string::~string(local_5e8);
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_f0);
  ParmParse::~ParmParse((ParmParse *)0x119854d);
  return;
}

Assistant:

void
Build (const Geometry& geom, int required_coarsening_level,
       int max_coarsening_level, int ngrow, bool build_coarse_level_by_coarsening,
       bool a_extend_domain_face, int a_num_coarsen_opt)
{
    ParmParse pp("eb2");
    std::string geom_type;
    pp.get("geom_type", geom_type);

    if (geom_type == "all_regular")
    {
        EB2::AllRegularIF rif;
        EB2::GeometryShop<EB2::AllRegularIF> gshop(rif);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "box")
    {
        RealArray lo;
        pp.get("box_lo", lo);

        RealArray hi;
        pp.get("box_hi", hi);

        bool has_fluid_inside;
        pp.get("box_has_fluid_inside", has_fluid_inside);

        EB2::BoxIF bf(lo, hi, has_fluid_inside);

        EB2::GeometryShop<EB2::BoxIF> gshop(bf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "cylinder")
    {
        RealArray center;
        pp.get("cylinder_center", center);

        Real radius;
        pp.get("cylinder_radius", radius);

        Real height = -1.0;
        pp.queryAdd("cylinder_height", height);

        int direction;
        pp.get("cylinder_direction", direction);
        AMREX_ALWAYS_ASSERT_WITH_MESSAGE(direction >=0 && direction < 3,
                                         "eb2.cylinder_direction is invalid");

        bool has_fluid_inside;
        pp.get("cylinder_has_fluid_inside", has_fluid_inside);

        EB2::CylinderIF cf(radius, height, direction, center, has_fluid_inside);

        EB2::GeometryShop<EB2::CylinderIF> gshop(cf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "plane")
    {
        RealArray point;
        pp.get("plane_point", point);

        RealArray normal;
        pp.get("plane_normal", normal);

        EB2::PlaneIF pf(point, normal);

        EB2::GeometryShop<EB2::PlaneIF> gshop(pf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "sphere")
    {
        RealArray center;
        pp.get("sphere_center", center);

        Real radius;
        pp.get("sphere_radius", radius);

        bool has_fluid_inside;
        pp.get("sphere_has_fluid_inside", has_fluid_inside);

        EB2::SphereIF sf(radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::SphereIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "torus")
    {
        RealArray center;
        pp.get("torus_center", center);

        Real small_radius;
        pp.get("torus_small_radius", small_radius);

        Real large_radius;
        pp.get("torus_large_radius", large_radius);

        bool has_fluid_inside = true;

        EB2::TorusIF sf(large_radius, small_radius, center, has_fluid_inside);

        EB2::GeometryShop<EB2::TorusIF> gshop(sf);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "parser")
    {
        std::string fn_string;
        pp.get("parser_function", fn_string);
        Parser parser(fn_string);
        parser.registerVariables({"x","y","z"});
        EB2::ParserIF pif(parser.compile<3>());
        EB2::GeometryShop<EB2::ParserIF,Parser> gshop(pif,parser);
        EB2::Build(gshop, geom, required_coarsening_level,
                   max_coarsening_level, ngrow, build_coarse_level_by_coarsening,
                   a_extend_domain_face, a_num_coarsen_opt);
    }
    else if (geom_type == "stl")
    {
        std::string stl_file;
        pp.get("stl_file", stl_file);
        Real stl_scale = 1._rt;
        pp.queryAdd("stl_scale", stl_scale);
        std::vector<Real> stl_center{0.0_rt, 0.0_rt, 0.0_rt};
        pp.queryAdd("stl_center", stl_center);
        int stl_reverse_normal = 0;
        pp.queryAdd("stl_reverse_normal", stl_reverse_normal);
        IndexSpace::push(new IndexSpaceSTL(stl_file, stl_scale,
                                           {stl_center[0], stl_center[1], stl_center[2]},
                                           stl_reverse_normal,
                                           geom, required_coarsening_level,
                                           max_coarsening_level, ngrow,
                                           build_coarse_level_by_coarsening,
                                           a_extend_domain_face,
                                           a_num_coarsen_opt));
    }
    else
    {
        amrex::Abort("geom_type "+geom_type+ " not supported");
    }
}